

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_on_write.h
# Opt level: O1

void __thiscall
copy_on_write<BaseType>::copy_on_write<DerivedType,void>
          (copy_on_write<BaseType> *this,copy_on_write<DerivedType> *c)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  shared_control_block<BaseType> *__tmp;
  delegating_shared_control_block<BaseType,_DerivedType> *local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  undefined1 local_19;
  
  this->ptr_ = (BaseType *)0x0;
  (this->cb_).super___shared_ptr<shared_control_block<BaseType>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->cb_).super___shared_ptr<shared_control_block<BaseType>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->ptr_ = &c->ptr_->super_BaseType;
  local_30 = (delegating_shared_control_block<BaseType,_DerivedType> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<delegating_shared_control_block<BaseType,DerivedType>,std::allocator<delegating_shared_control_block<BaseType,DerivedType>>,std::shared_ptr<shared_control_block<DerivedType>>>
            (&local_28,&local_30,
             (allocator<delegating_shared_control_block<BaseType,_DerivedType>_> *)&local_19,&c->cb_
            );
  if (local_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_28._M_pi)->_M_use_count = (local_28._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_28._M_pi)->_M_use_count = (local_28._M_pi)->_M_use_count + 1;
    }
  }
  (this->cb_).super___shared_ptr<shared_control_block<BaseType>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = &local_30->super_shared_control_block<BaseType>;
  this_00 = (this->cb_).
            super___shared_ptr<shared_control_block<BaseType>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->cb_).super___shared_ptr<shared_control_block<BaseType>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_28._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (local_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28._M_pi);
  }
  c->ptr_ = (DerivedType *)0x0;
  return;
}

Assistant:

copy_on_write(copy_on_write<U>&& c)
  {
    ptr_ = c.ptr_;
    cb_ = std::static_pointer_cast<shared_control_block<T>>(
        std::make_shared<delegating_shared_control_block<T, U>>(
            std::move(c.cb_)));
    c.ptr_ = nullptr;
  }